

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgRuleWavelet.cpp
# Opt level: O2

double __thiscall TasGrid::RuleWavelet::eval<0>(RuleWavelet *this,int point,double x)

{
  double dVar1;
  double dVar2;
  
  if (this->order == 3) {
    dVar1 = eval_cubic<0>(this,point,x);
    return dVar1;
  }
  dVar1 = 0.0;
  if (this->order == 1) {
    if (2 < point) {
      dVar1 = eval_linear<0>(this,point,x);
      return dVar1;
    }
    dVar1 = getNode(this,point);
    dVar2 = 1.0 - ABS(x - dVar1);
    dVar1 = 0.0;
    if (0.0 <= dVar2) {
      dVar1 = dVar2;
    }
  }
  return dVar1;
}

Assistant:

double RuleWavelet::eval(int point, double x) const{
    // Evaluates or differentiates a wavelet designated by point at coordinate x.
    if(order == 1){
        // Level 0
        if (point < 3){
            double node = getNode(point);
            if (mode == 0) {
                double w = 1.0 - std::abs(x - node);
                return (w < 0.0) ? 0.0 : w;
            }else{
                // Preserve the symmetry of derivatives as much as possible.
                if (point == 0) return (x < 0.0) ? 1.0 : -1.0;
                else if (point == 1) return (x < 0.0) ? -1.0 : 0.0;
                else return (x < 0.0) ? 0.0 : 1.0;
            }
        }
        // Level 1+
        return eval_linear<mode>(point, x);
    }
    else if(order == 3){
        return eval_cubic<mode>(point, x);
    }
    return 0.;
}